

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O2

int Kit_GraphToGiaInternal(Gia_Man_t *pMan,Kit_Graph_t *pGraph,int fHash)

{
  uint iLit0;
  uint uVar1;
  uint uVar2;
  int iVar3;
  Kit_Node_t *pKVar4;
  long lVar5;
  Gia_Obj_t *pGVar6;
  uint *puVar7;
  int *__ptr;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 *puVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (pGraph->fConst != 0) {
    return ~(uint)pGraph->eRoot & 1;
  }
  uVar15 = (ulong)(uint)pGraph->nLeaves;
  if (((uint)pGraph->eRoot >> 1 & 0x3fffffff) < (uint)pGraph->nLeaves) {
    pKVar4 = Kit_GraphVar(pGraph);
    iVar3 = (pKVar4->field_2).iFunc;
  }
  else {
    lVar13 = uVar15 * 0x18;
    puVar11 = (undefined1 *)0x0;
    for (; (long)uVar15 < (long)pGraph->nSize; uVar15 = uVar15 + 1) {
      pKVar4 = pGraph->pNodes;
      uVar1 = *(uint *)(&(pKVar4->eEdge0).field_0x0 + lVar13);
      iLit0 = Abc_LitNotCond(pKVar4[uVar1 >> 1 & 0x3fffffff].field_2.iFunc,uVar1 & 1);
      uVar1 = *(uint *)(&(pKVar4->eEdge1).field_0x0 + lVar13);
      uVar1 = Abc_LitNotCond(pGraph->pNodes[uVar1 >> 1 & 0x3fffffff].field_2.iFunc,uVar1 & 1);
      if (fHash == 0) {
        if (pMan->fGiaSimple == 0) {
          uVar2 = iLit0;
          if (iLit0 < 2) {
            uVar2 = uVar1;
            if (iLit0 == 0) {
              uVar2 = iLit0;
            }
          }
          else if (uVar1 < 2) {
            if (uVar1 == 0) {
              uVar2 = uVar1;
            }
          }
          else if ((iLit0 != uVar1) && (uVar2 = 0, (uVar1 ^ iLit0) != 1)) goto LAB_004ce56d;
        }
        else {
LAB_004ce56d:
          uVar2 = pMan->nObjs;
          if (uVar2 == pMan->nObjsAlloc) {
            uVar10 = uVar2 * 2;
            if (0x1fffffff < (int)(uVar2 * 2)) {
              uVar10 = 0x20000000;
            }
            if (uVar2 == 0x20000000) {
              puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
              exit(1);
            }
            if ((int)uVar10 <= (int)uVar2) {
              __assert_fail("p->nObjs < nObjNew",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x289,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
            }
            if (pMan->fVerbose != 0) {
              printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar2,(ulong)uVar10);
              uVar2 = pMan->nObjsAlloc;
            }
            if ((int)uVar2 < 1) {
              __assert_fail("p->nObjsAlloc > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x28c,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
            }
            lVar5 = (long)(int)uVar10;
            if (pMan->pObjs == (Gia_Obj_t *)0x0) {
              pGVar6 = (Gia_Obj_t *)malloc(lVar5 * 0xc);
            }
            else {
              pGVar6 = (Gia_Obj_t *)realloc(pMan->pObjs,lVar5 * 0xc);
              uVar2 = pMan->nObjsAlloc;
            }
            pMan->pObjs = pGVar6;
            memset(pGVar6 + (int)uVar2,0,(long)(int)(uVar10 - uVar2) * 0xc);
            if (pMan->pMuxes != (uint *)0x0) {
              puVar7 = (uint *)realloc(pMan->pMuxes,lVar5 * 4);
              pMan->pMuxes = puVar7;
              memset(puVar7 + pMan->nObjsAlloc,0,(lVar5 - pMan->nObjsAlloc) * 4);
            }
            pMan->nObjsAlloc = uVar10;
          }
          if ((pMan->vHTable).nSize != 0) {
            iVar3 = (pMan->vHash).nSize;
            if (iVar3 == (pMan->vHash).nCap) {
              uVar2 = iVar3 * 2;
              if (iVar3 < 0x10) {
                uVar2 = 0x10;
              }
              __ptr = (pMan->vHash).pArray;
              if (iVar3 < (int)uVar2) {
                if (__ptr == (int *)0x0) {
                  __ptr = (int *)malloc((ulong)uVar2 << 2);
                }
                else {
                  __ptr = (int *)realloc(__ptr,(ulong)uVar2 << 2);
                }
                (pMan->vHash).pArray = __ptr;
                if (__ptr == (int *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                (pMan->vHash).nCap = uVar2;
                iVar3 = (pMan->vHash).nSize;
              }
            }
            else {
              __ptr = (pMan->vHash).pArray;
            }
            (pMan->vHash).nSize = iVar3 + 1;
            __ptr[iVar3] = 0;
          }
          iVar3 = pMan->nObjs;
          pMan->nObjs = iVar3 + 1;
          pGVar6 = Gia_ManObj(pMan,iVar3);
          uVar2 = iLit0 >> 1;
          if (pMan->nObjs <= (int)uVar2) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar10 = uVar1 >> 1;
          if ((uint)pMan->nObjs <= uVar10) {
            __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          if ((uVar2 == uVar10) && (pMan->fGiaSimple == 0)) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          iVar3 = Gia_ObjId(pMan,pGVar6);
          uVar8 = (ulong)(iVar3 - uVar2 & 0x1fffffff);
          if (iLit0 < uVar1) {
            *(ulong *)pGVar6 =
                 (ulong)((iLit0 & 1) << 0x1d) | *(ulong *)pGVar6 & 0xffffffffc0000000 | uVar8;
            iVar3 = Gia_ObjId(pMan,pGVar6);
            uVar8 = (ulong)(iVar3 - uVar10 & 0x1fffffff) << 0x20;
            uVar9 = *(ulong *)pGVar6 & 0xc0000000ffffffff;
            uVar14 = (ulong)(uVar1 & 1) << 0x3d;
          }
          else {
            *(ulong *)pGVar6 =
                 (ulong)(iLit0 & 1) << 0x3d | *(ulong *)pGVar6 & 0xc0000000ffffffff | uVar8 << 0x20;
            iVar3 = Gia_ObjId(pMan,pGVar6);
            uVar8 = (ulong)(iVar3 - uVar10 & 0x1fffffff);
            uVar9 = *(ulong *)pGVar6 & 0xffffffffc0000000;
            uVar14 = (ulong)((uVar1 & 1) << 0x1d);
          }
          uVar8 = uVar14 | uVar9 | uVar8;
          *(ulong *)pGVar6 = uVar8;
          if (pMan->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(pMan,pGVar6 + -(uVar8 & 0x1fffffff),pGVar6);
            Gia_ObjAddFanout(pMan,pGVar6 + -((ulong)*(uint *)&pGVar6->field_0x4 & 0x1fffffff),pGVar6
                            );
          }
          if (pMan->fSweeper != 0) {
            uVar9 = *(ulong *)pGVar6 & 0x1fffffff;
            uVar8 = *(ulong *)pGVar6 >> 0x20 & 0x1fffffff;
            uVar14 = 0x4000000000000000;
            if (((uint)*(ulong *)(pGVar6 + -uVar9) >> 0x1e & 1) == 0) {
              uVar14 = 0x40000000;
            }
            *(ulong *)(pGVar6 + -uVar9) = uVar14 | *(ulong *)(pGVar6 + -uVar9);
            uVar14 = *(ulong *)(pGVar6 + -uVar8);
            uVar12 = 0x4000000000000000;
            if (((uint)uVar14 >> 0x1e & 1) == 0) {
              uVar12 = 0x40000000;
            }
            *(ulong *)(pGVar6 + -uVar8) = uVar12 | uVar14;
            uVar8 = *(ulong *)pGVar6;
            *(ulong *)pGVar6 =
                 uVar8 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar8 >> 0x3d) ^ (uint)(uVar14 >> 0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pGVar6 + -uVar9) >> 0x3f) ^
                        (uint)(uVar8 >> 0x1d) & 7)) << 0x3f;
          }
          if (pMan->fBuiltInSim != 0) {
            uVar8 = *(ulong *)pGVar6;
            *(ulong *)pGVar6 =
                 uVar8 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar8 >> 0x3d) ^
                         (uint)((ulong)*(undefined8 *)(pGVar6 + -(uVar8 >> 0x20 & 0x1fffffff)) >>
                               0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pGVar6 + -(uVar8 & 0x1fffffff)) >> 0x3f) ^
                        (uint)(uVar8 >> 0x1d) & 7)) << 0x3f;
            iVar3 = Gia_ObjId(pMan,pGVar6);
            Gia_ManBuiltInSimPerform(pMan,iVar3);
          }
          if (pMan->vSuppWords != (Vec_Wrd_t *)0x0) {
            Gia_ManQuantSetSuppAnd(pMan,pGVar6);
          }
          iVar3 = Gia_ObjId(pMan,pGVar6);
          uVar2 = iVar3 * 2;
        }
      }
      else {
        uVar2 = Gia_ManHashAnd(pMan,iLit0,uVar1);
      }
      *(uint *)((long)&pKVar4->field_2 + lVar13) = uVar2;
      puVar11 = &(pKVar4->eEdge0).field_0x0 + lVar13;
      lVar13 = lVar13 + 0x18;
    }
    iVar3 = *(int *)(puVar11 + 8);
  }
  iVar3 = Abc_LitNotCond(iVar3,(uint)pGraph->eRoot & 1);
  return iVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Kit_GraphToGiaInternal( Gia_Man_t * pMan, Kit_Graph_t * pGraph, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i, pAnd0, pAnd1;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Kit_GraphVar(pGraph)->iFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        if ( fHash )
            pNode->iFunc = Gia_ManHashAnd( pMan, pAnd0, pAnd1 );
        else
            pNode->iFunc = Gia_ManAppendAnd2( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Kit_GraphIsComplement(pGraph) );
}